

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

void mayberem(obj *obj,char *str)

{
  schar sVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1b8;
  char local_198 [8];
  char hairbuf [256];
  char qbuf [128];
  char *str_local;
  obj *obj_local;
  
  if ((obj != (obj *)0x0) && (obj->owornmask != 0)) {
    iVar3 = rn2(0x14);
    sVar1 = acurr(5);
    if (iVar3 < sVar1) {
      iVar3 = rn2(2);
      if (iVar3 == 0) {
        local_1b8 = "lover";
      }
      else {
        iVar3 = rn2(2);
        local_1b8 = "sweetheart";
        if (iVar3 == 0) {
          local_1b8 = "dear";
        }
      }
      sprintf(hairbuf + 0xf8,"\"Shall I remove your %s, %s?\"",str,local_1b8);
      cVar2 = yn_function(hairbuf + 0xf8,"yn",'n');
      if (cVar2 == 'n') {
        return;
      }
    }
    else {
      pcVar4 = body_part(0xe);
      sprintf(local_198,"let me run my fingers through your %s",pcVar4);
      if (obj == uarm) {
        local_1d0 = "let\'s get a little closer";
      }
      else {
        if ((obj == uarmc) || (obj == uarms)) {
          local_1d8 = "it\'s in the way";
        }
        else {
          if (obj == uarmf) {
            local_1e0 = "let me rub your feet";
          }
          else {
            if (obj == uarmg) {
              local_1e8 = "they\'re too clumsy";
            }
            else {
              if (obj == uarmu) {
                local_1f0 = "let me massage you";
              }
              else {
                local_1f0 = local_198;
              }
              local_1e8 = local_1f0;
            }
            local_1e0 = local_1e8;
          }
          local_1d8 = local_1e0;
        }
        local_1d0 = local_1d8;
      }
      verbalize("Take off your %s; %s.",str,local_1d0);
    }
    remove_worn_item(obj,'\x01');
  }
  return;
}

Assistant:

static void mayberem(struct obj *obj, const char *str)
{
	char qbuf[QBUFSZ];

	if (!obj || !obj->owornmask) return;

	if (rn2(20) < ACURR(A_CHA)) {
		sprintf(qbuf,"\"Shall I remove your %s, %s?\"",
			str,
			(!rn2(2) ? "lover" : !rn2(2) ? "dear" : "sweetheart"));
		if (yn(qbuf) == 'n') return;
	} else {
		char hairbuf[BUFSZ];

		sprintf(hairbuf, "let me run my fingers through your %s",
			body_part(HAIR));
		verbalize("Take off your %s; %s.", str,
			(obj == uarm)  ? "let's get a little closer" :
			(obj == uarmc || obj == uarms) ? "it's in the way" :
			(obj == uarmf) ? "let me rub your feet" :
			(obj == uarmg) ? "they're too clumsy" :
			(obj == uarmu) ? "let me massage you" :
			/* obj == uarmh */
			hairbuf);
	}
	remove_worn_item(obj, TRUE);
}